

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteParamTypes(CWriter *this,FuncDeclaration *decl)

{
  uint uVar1;
  Index IVar2;
  Type type;
  string_view local_30;
  uint local_1c;
  FuncDeclaration *pFStack_18;
  Index i;
  FuncDeclaration *decl_local;
  CWriter *this_local;
  
  pFStack_18 = decl;
  decl_local = (FuncDeclaration *)this;
  IVar2 = FuncDeclaration::GetNumParams(decl);
  if (IVar2 != 0) {
    for (local_1c = 0; uVar1 = local_1c, IVar2 = FuncDeclaration::GetNumParams(pFStack_18),
        uVar1 < IVar2; local_1c = local_1c + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,", ");
      Write(this,local_30);
      type = FuncDeclaration::GetParamType(pFStack_18,local_1c);
      Write(this,type);
    }
  }
  return;
}

Assistant:

void CWriter::WriteParamTypes(const FuncDeclaration& decl) {
  if (decl.GetNumParams() != 0) {
    for (Index i = 0; i < decl.GetNumParams(); ++i) {
      Write(", ");
      Write(decl.GetParamType(i));
    }
  }
}